

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::FirstMatchAssertionExpr::serializeTo
          (FirstMatchAssertionExpr *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  
  ASTSerializer::write(serializer,3,"seq",(size_t)this->seq);
  name._M_str = "matchItems";
  name._M_len = 10;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->matchItems).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->matchItems).data_;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void FirstMatchAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("seq", seq);

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}